

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

double __thiscall
ON_SubDEdge::GetSharpSubdivisionPoint(ON_SubDEdge *this,ON_3dPoint *sharp_subdivision_point)

{
  ON_SubDEdgeSharpness OVar1;
  double dVar2;
  bool bVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  undefined4 uVar7;
  ON_3dPoint local_30;
  
  bVar3 = IsSharp(this);
  if (bVar3) {
    OVar1 = Sharpness(this,false);
    fVar4 = OVar1.m_edge_sharpness[0];
    fVar6 = OVar1.m_edge_sharpness[1];
    dVar2 = (double)fVar4;
    if ((fVar4 != fVar6) || (NAN(fVar4) || NAN(fVar6))) {
      dVar2 = ON_SubDEdgeSharpness::Sanitize((dVar2 + (double)fVar6) * 0.5,0.0);
    }
    ControlNetCenterPoint(&local_30,this);
    sharp_subdivision_point->z = local_30.z;
    sharp_subdivision_point->x = local_30.x;
    sharp_subdivision_point->y = local_30.y;
    uVar5 = SUB84(dVar2,0);
    uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    sharp_subdivision_point->z = ON_3dPoint::NanPoint.z;
    dVar2 = ON_3dPoint::NanPoint.y;
    sharp_subdivision_point->x = ON_3dPoint::NanPoint.x;
    sharp_subdivision_point->y = dVar2;
    uVar5 = 0;
    uVar7 = 0;
  }
  return (double)CONCAT44(uVar7,uVar5);
}

Assistant:

double ON_SubDEdge::GetSharpSubdivisionPoint(ON_3dPoint& sharp_subdivision_point) const
{
  if (IsSharp())
  {
    const double s = Sharpness(false).Average();
    sharp_subdivision_point = this->ControlNetCenterPoint();
    return s;
  }

  sharp_subdivision_point = ON_3dPoint::NanPoint;
  return 0.0;
}